

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_state_callback_remove(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  callback_data_s *tmp;
  fio_ls_embd_s *pos;
  void *arg_local;
  _func_void_void_ptr *func_local;
  callback_type_e c_type_local;
  
  if ((-1 < (int)c_type) && (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK))) {
    fio_lock(&callback_collection[c_type].lock);
    for (tmp = (callback_data_s *)callback_collection[c_type].callbacks.next;
        tmp != (callback_data_s *)&callback_collection[c_type].callbacks;
        tmp = (callback_data_s *)(tmp->node).next) {
      if ((tmp->func == func) && (tmp->arg == arg)) {
        fio_ls_embd_remove(&tmp->node);
        free(tmp);
        fio_unlock(&callback_collection[c_type].lock);
        return 0;
      }
    }
    fio_unlock(&callback_collection[c_type].lock);
  }
  return -1;
}

Assistant:

int fio_state_callback_remove(callback_type_e c_type, void (*func)(void *),
                              void *arg) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return -1;
  fio_lock(&callback_collection[c_type].lock);
  FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
    callback_data_s *tmp = (FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
    if (tmp->func == func && tmp->arg == arg) {
      fio_ls_embd_remove(&tmp->node);
      free(tmp);
      goto success;
    }
  }
  fio_unlock(&callback_collection[c_type].lock);
  return -1;
success:
  fio_unlock(&callback_collection[c_type].lock);
  return -0;
}